

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O2

t_float slider_getfval(t_slider *x)

{
  double dVar1;
  t_iem_fstyle_flags tVar2;
  int iVar3;
  int iVar4;
  t_float tVar5;
  double dVar6;
  
  tVar2 = (x->x_gui).x_fsf;
  iVar3 = x->x_val;
  iVar4 = iVar3;
  if (((uint)tVar2 >> 0x19 & 1) == 0) {
    iVar4 = iVar3 - iVar3 % 100;
  }
  if ((tVar2._0_1_ < '\0') && ((x->x_gui).x_snd == (x->x_gui).x_rcv)) {
    iVar4 = iVar3;
  }
  if (x->x_lin0_log1 == 0) {
    dVar6 = (double)iVar4 * 0.01 * x->x_k + x->x_min;
  }
  else {
    dVar1 = x->x_min;
    dVar6 = exp(x->x_k * (double)iVar4 * 0.01);
    dVar6 = dVar6 * dVar1;
  }
  tVar5 = 0.0;
  if (1e-10 <= ABS((float)dVar6)) {
    tVar5 = (float)dVar6;
  }
  return tVar5;
}

Assistant:

static t_float slider_getfval(t_slider *x)
{
    t_float fval;
    int rounded_val = (x->x_gui.x_fsf.x_finemoved) ? x->x_val : (x->x_val / 100) * 100;

    /* if rcv==snd, don't round the value to prevent bad dragging when zoomed-in */
    if(x->x_gui.x_fsf.x_snd_able && (x->x_gui.x_snd == x->x_gui.x_rcv))
        rounded_val = x->x_val;

    if (x->x_lin0_log1)
        fval = x->x_min * exp(x->x_k * (double)(rounded_val) * 0.01);
    else fval = (double)(rounded_val) * 0.01 * x->x_k + x->x_min;
    if ((fval < 1.0e-10) && (fval > -1.0e-10))
        fval = 0.0;
    return (fval);
}